

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  ScriptContext *this_00;
  JavascriptString *this_01;
  undefined8 *puVar2;
  code *pcVar3;
  bool bVar4;
  PropertyAttributes PVar5;
  charcount_t cVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  JavascriptString **ppJVar10;
  PropertyRecord *string1;
  UndeclaredBlockVariable *pUVar11;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar12;
  PropertyRecord *pPVar13;
  unsigned_short uVar14;
  DynamicObject *pDVar15;
  ushort local_3a;
  uint local_38;
  char cStack_34;
  unsigned_short propertyIndex;
  
  _cStack_34 = flags;
  local_38 = propertyId;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar4) goto LAB_00e4187c;
    *puVar9 = 0;
  }
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  this_00 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((descriptor->Attributes & 8) == 0) {
    if ((_cStack_34 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (descriptor->Attributes & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(_cStack_34,this_00);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar12 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance);
      iVar7 = (*(pSVar12->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                        (pSVar12,instance,(ulong)(uint)propertyKey,value,(ulong)_cStack_34,info);
      return iVar7;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00e4187c;
        *puVar9 = 0;
      }
      DynamicObject::ChangeType(instance);
    }
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,instance,descriptor->propertyIndex,&local_3a), bVar4)) {
      ppJVar10 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),(uint)local_3a);
      this_01 = *ppJVar10;
      local_38 = propertyKey;
      pPVar13 = ScriptContext::GetPropertyName(this_00,propertyKey);
      cVar6 = JavascriptString::GetLength(this_01);
      if ((cVar6 == pPVar13->byteCount >> 1) && (0xf < (uint)pPVar13->pid)) {
        string1 = (PropertyRecord *)JavascriptString::GetString(this_01);
        cVar6 = JavascriptString::GetLength(this_01);
        if ((string1 != pPVar13 + 1) &&
           (iVar7 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(pPVar13 + 1),(ulong)cVar6),
           iVar7 != 0)) goto LAB_00e4143f;
      }
      else {
LAB_00e4143f:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar4) goto LAB_00e4187c;
        *puVar9 = 0;
      }
      descriptor = JsUtil::
                   BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                                      **)(this + 0x18),(uint)local_3a);
      propertyKey = local_38;
    }
    bVar4 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        *)this,this_00);
    if (bVar4) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>)
                   ((char)this[0x29] + -1);
    }
    descriptor->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != 0xffffffff) {
      ScriptContext::InvalidateProtoCaches(this_00,propertyKey);
    }
    descriptor->Attributes = '\a';
    local_38 = propertyKey;
  }
  if (descriptor->propertyIndex != 0xffff) {
    if ((((-1 < cStack_34) && (0x3f < descriptor->Attributes)) &&
        (pUVar11 = (UndeclaredBlockVariable *)
                   DynamicObject::GetSlot(instance,(uint)descriptor->propertyIndex),
        (_cStack_34 >> 8 & 1) == 0)) &&
       ((((this_00->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
        pUVar11)) {
      JavascriptError::ThrowReferenceError(this_00,-0x7ff5ec07,(PCWSTR)0x0);
    }
    puVar2 = *(undefined8 **)(this + 0x20);
    if (puVar2 == (undefined8 *)0x0) {
      pDVar15 = (DynamicObject *)0x0;
    }
    else {
      pDVar15 = (DynamicObject *)*puVar2;
    }
    if (pDVar15 != instance && puVar2 != (undefined8 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x588,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar4) goto LAB_00e4187c;
      *puVar9 = 0;
    }
    if ((*(byte *)descriptor & 2) == 0) {
      if ((((_cStack_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (*(byte *)descriptor = *(byte *)descriptor | 2, pDVar15 == instance)) &&
         ((_cStack_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < (uint)propertyKey)) {
        if (((byte)this[9] & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x594,"(!GetIsShared())","!GetIsShared()");
          if (!bVar4) goto LAB_00e4187c;
          *puVar9 = 0;
        }
        if (value == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x595,"(value != nullptr)","value != nullptr");
          if (!bVar4) goto LAB_00e4187c;
          *puVar9 = 0;
        }
        BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar8 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar4) {
LAB_00e4187c:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        bVar4 = VarIs<Js::JavascriptFunction>(value);
        if (bVar4) {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_38,value);
          }
        }
        *(byte *)descriptor = *(byte *)descriptor & 0xfb | bVar4 << 2;
      }
    }
    else {
      pPVar13 = ScriptContext::GetPropertyName(this_00,propertyKey);
      InvalidateFixedField<Js::PropertyRecord_const*>
                (this,pPVar13,descriptor,
                 (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)descriptor->propertyIndex,value);
    if (((uint)*descriptor & 6) == 2) {
      if (info == (PropertyValueInfo *)0x0) goto LAB_00e41808;
      PVar5 = descriptor->Attributes;
      uVar14 = descriptor->propertyIndex;
    }
    else {
      if (info == (PropertyValueInfo *)0x0) goto LAB_00e41808;
      uVar14 = 0xffff;
      PVar5 = '\0';
    }
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = uVar14;
    info->m_attributes = PVar5;
    info->flags = InlineCacheNoFlags;
  }
LAB_00e41808:
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(local_38,propertyKey);
  if (propertyKey != 0xffffffff) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }